

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O2

PaError PaUnixMutex_Lock(PaUnixMutex *self)

{
  int __errnum;
  PaError PVar1;
  int iVar2;
  pthread_t __thread1;
  char *errorText;
  
  __errnum = pthread_mutex_lock((pthread_mutex_t *)self);
  PVar1 = 0;
  paUtilErr_ = __errnum;
  if (__errnum != 0) {
    __thread1 = pthread_self();
    iVar2 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar2 != 0) {
      errorText = strerror(__errnum);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)__errnum,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'pthread_mutex_lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/os/unix/pa_unix_util.c\', line: 527\n"
                     );
    PVar1 = -9999;
  }
  return PVar1;
}

Assistant:

PaError PaUnixMutex_Lock( PaUnixMutex* self )
{
    PaError result = paNoError;
    
#ifdef PTHREAD_CANCEL
	int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, &oldState ), 0 );
#endif
    PA_ENSURE_SYSTEM( pthread_mutex_lock( &self->mtx ), 0 );

error:
    return result;
}